

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcase.c
# Opt level: O3

void Curl_strntoupper(char *dest,char *src,size_t n)

{
  long lVar1;
  bool bVar2;
  
  if (n != 0) {
    lVar1 = 0;
    do {
      dest[lVar1] = ""[(byte)src[lVar1]];
      if (src[lVar1] == '\0') {
        return;
      }
      bVar2 = n - 1 != lVar1;
      lVar1 = lVar1 + 1;
    } while (bVar2);
  }
  return;
}

Assistant:

void Curl_strntoupper(char *dest, const char *src, size_t n)
{
  if(n < 1)
    return;

  do {
    *dest++ = Curl_raw_toupper(*src);
  } while(*src++ && --n);
}